

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char *value)

{
  ulong uVar1;
  size_t sVar2;
  size_t __n;
  format_error *this;
  buffer<char> *c;
  
  if (value != (char *)0x0) {
    __n = strlen(value);
    sVar2 = (out.container)->size_;
    uVar1 = sVar2 + __n;
    if ((out.container)->capacity_ < uVar1) {
      (**(out.container)->_vptr_buffer)(out.container,uVar1);
    }
    (out.container)->size_ = uVar1;
    if (__n != 0) {
      memmove((out.container)->ptr_ + sVar2,value,__n);
    }
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"string pointer is null");
  __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}